

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuSuiteSummary(CuSuite *testSuite,CuString *summary)

{
  CuTest *testCase;
  char *str;
  int i;
  CuString *summary_local;
  CuSuite *testSuite_local;
  
  for (str._4_4_ = 0; str._4_4_ < testSuite->count; str._4_4_ = str._4_4_ + 1) {
    if (testSuite->list[str._4_4_]->failed == 0) {
      if (testSuite->list[str._4_4_]->notImplemented == 0) {
        testCase = (CuTest *)anon_var_dwarf_115a;
      }
      else {
        testCase = (CuTest *)anon_var_dwarf_114f;
      }
    }
    else {
      testCase = (CuTest *)anon_var_dwarf_1144;
    }
    CuStringAppend(summary,(char *)testCase);
  }
  CuStringAppend(summary,"\n\n");
  return;
}

Assistant:

void CuSuiteSummary(CuSuite* testSuite, CuString* summary)
{
	int i;
	char* str;

	for (i = 0 ; i < testSuite->count ; ++i)
	{
		CuTest* testCase = testSuite->list[i];

		if (testCase->failed)
			str = "F";
		else if (testCase->notImplemented)
			str = "N";
		else
			str = ".";

		CuStringAppend(summary, str);
	}
	CuStringAppend(summary, "\n\n");
}